

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,ExtPrivkey *ext_privkey,string *child_path,ByteData *finterprint)

{
  Privkey *this_00;
  undefined1 local_e8 [40];
  ByteData256 local_c0;
  ByteData local_a8;
  bool local_90;
  undefined3 uStack_8f;
  NetType NStack_8c;
  ByteData local_88;
  ByteData256 local_70;
  ExtPubkey *local_58;
  ExtPrivkey *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  Pubkey::Pubkey(&this->pubkey_);
  this_00 = &this->privkey_;
  Privkey::Privkey(this_00);
  Extkey::Extkey(&(this->extprivkey_).super_Extkey,&ext_privkey->super_Extkey);
  local_58 = &this->extpubkey_;
  local_50 = &this->extprivkey_;
  Extkey::Extkey(&local_58->super_Extkey);
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->fingerprint_,
             &finterprint->data_);
  if (child_path->_M_string_length != 0) {
    local_e8._0_8_ = local_e8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"KeyData","");
    ToArrayFromString(&local_48,child_path,(string *)local_e8,'\0');
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              (&this->path_,&local_48);
    if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
  }
  ExtPrivkey::GetExtPubkey((ExtPubkey *)local_e8,ext_privkey);
  (this->extpubkey_).super_Extkey.version_ = local_e8._0_4_;
  ByteData::operator=(&(this->extpubkey_).super_Extkey.fingerprint_,(ByteData *)(local_e8 + 8));
  (this->extpubkey_).super_Extkey.depth_ = local_e8[0x20];
  *(undefined3 *)&(this->extpubkey_).super_Extkey.field_0x21 = local_e8._33_3_;
  (this->extpubkey_).super_Extkey.child_num_ = local_e8._36_4_;
  ByteData256::operator=(&(this->extpubkey_).super_Extkey.chaincode_,&local_c0);
  ByteData::operator=(&(this->extpubkey_).super_Extkey.privkey_.data_,&local_a8);
  (this->extpubkey_).super_Extkey.privkey_.is_compressed_ = local_90;
  *(undefined3 *)&(this->extpubkey_).super_Extkey.privkey_.field_0x19 = uStack_8f;
  (this->extpubkey_).super_Extkey.privkey_.net_type_ = NStack_8c;
  ByteData::operator=(&(this->extpubkey_).super_Extkey.pubkey_.data_,&local_88);
  ByteData256::operator=(&(this->extpubkey_).super_Extkey.tweak_sum_,&local_70);
  if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_e8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_e8._8_8_,local_e8._24_8_ - local_e8._8_8_);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &(ext_privkey->super_Extkey).privkey_);
  local_e8[0x18] = (ext_privkey->super_Extkey).privkey_.is_compressed_;
  local_e8._25_3_ = *(undefined3 *)&(ext_privkey->super_Extkey).privkey_.field_0x19;
  local_e8._28_4_ = (ext_privkey->super_Extkey).privkey_.net_type_;
  ByteData::operator=(&this_00->data_,(ByteData *)local_e8);
  (this->privkey_).is_compressed_ = (bool)local_e8[0x18];
  *(undefined3 *)&(this->privkey_).field_0x19 = local_e8._25_3_;
  (this->privkey_).net_type_ = local_e8._28_4_;
  if ((pointer)local_e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ - local_e8._0_8_);
  }
  Privkey::GetPubkey((Pubkey *)local_e8,this_00);
  ByteData::operator=((ByteData *)this,(ByteData *)local_e8);
  if ((pointer)local_e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ - local_e8._0_8_);
  }
  return;
}

Assistant:

KeyData::KeyData(
    const ExtPrivkey& ext_privkey, const std::string& child_path,
    const ByteData& finterprint)
    : extprivkey_(ext_privkey), fingerprint_(finterprint) {
  if (!child_path.empty()) {
    path_ = ToArrayFromString(child_path, "KeyData", 0);
  }
  extpubkey_ = ext_privkey.GetExtPubkey();
  privkey_ = ext_privkey.GetPrivkey();
  pubkey_ = privkey_.GetPubkey();
}